

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry_test.cpp
# Opt level: O2

void __thiscall
test::test_most_advanced_license_error::test_method(test_most_advanced_license_error *this)

{
  AuditEvent_conflict *pAVar1;
  allocator local_161;
  undefined **local_160;
  ulong local_158;
  shared_count sStack_150;
  char *local_148;
  undefined1 local_140 [24];
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  shared_count sStack_110;
  EventRegistry er;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  
  license::EventRegistry::EventRegistry(&er);
  license::EventRegistry::addEvent(&er,LICENSE_SPECIFIED,"lic2",(char *)0x0);
  license::EventRegistry::addEvent(&er,LICENSE_FOUND,"lic1",(char *)0x0);
  license::EventRegistry::addEvent(&er,LICENSE_CORRUPTED,"lic1",(char *)0x0);
  license::EventRegistry::turnWarningsIntoErrors(&er);
  pAVar1 = license::EventRegistry::getLastFailure(&er);
  local_38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_30 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_38,0x22);
  local_160 = (undefined **)CONCAT71(local_160._1_7_,pAVar1 != (AuditEvent_conflict *)0x0);
  local_158 = 0;
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_140[8] = 0;
  local_140._0_8_ = &PTR__lazy_ostream_001c24b8;
  local_140._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_128 = "An error is detected";
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_50 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_150);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x23);
  std::__cxx11::string::string((string *)local_140,"lic1",&local_161);
  local_120 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_140,pAVar1->license_reference);
  local_118 = 0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_158 = local_158 & 0xffffffffffffff00;
  local_160 = &PTR__lazy_ostream_001c2508;
  sStack_150.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = "Error is for lic1";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_80 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_110);
  std::__cxx11::string::~string((string *)local_140);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
  ;
  local_90 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x24);
  local_160 = (undefined **)CONCAT71(local_160._1_7_,pAVar1->event_type == LICENSE_CORRUPTED);
  local_158 = 0;
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_140[8] = 0;
  local_140._0_8_ = &PTR__lazy_ostream_001c2548;
  local_140._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_128 = "Error is for LICENSE_CORRUPTED";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_150);
  license::EventRegistry::~EventRegistry(&er);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_most_advanced_license_error) {
	EventRegistry er;
	er.addEvent(LICENSE_SPECIFIED, "lic2");
	er.addEvent(LICENSE_FOUND, "lic1");
	er.addEvent(LICENSE_CORRUPTED, "lic1");
	er.turnWarningsIntoErrors();
	const AuditEvent *event = er.getLastFailure();
	BOOST_CHECK_MESSAGE(event != nullptr, "An error is detected");
	BOOST_CHECK_MESSAGE(string("lic1") == event->license_reference, "Error is for lic1");
	BOOST_CHECK_MESSAGE(LICENSE_CORRUPTED == event->event_type, "Error is for LICENSE_CORRUPTED");
}